

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-test.c++
# Opt level: O3

void __thiscall
capnp::_::anon_unknown_0::TestDynamicStructHandler::encode
          (TestDynamicStructHandler *this,JsonCodec *codec,Reader input,Builder output)

{
  Builder output_00;
  Field field_00;
  Field field_01;
  StructSchema SVar1;
  bool bVar2;
  uint index;
  Type type;
  Fault f;
  Field field;
  Builder items;
  FieldList fields;
  undefined1 local_150 [40];
  JsonCodec *local_128;
  Fault local_120;
  undefined1 local_118 [16];
  StructReader local_108;
  ListBuilder local_d8;
  FieldList local_b0;
  Reader local_78;
  
  local_118._0_8_ = input.schema.super_Schema.raw;
  local_128 = codec;
  StructSchema::getFields(&local_b0,(StructSchema *)local_118);
  *(undefined2 *)output._builder.data = 4;
  local_118._0_8_ = output._builder.segment;
  local_118._8_8_ = output._builder.capTable;
  local_108.segment = (SegmentReader *)output._builder.pointers;
  PointerBuilder::initStructList
            (&local_d8,(PointerBuilder *)local_118,local_b0.list.reader.elementCount,
             (StructSize)0x10002);
  if (local_b0.list.reader.elementCount != 0) {
    index = 0;
    do {
      SVar1.super_Schema.raw = (Schema)(Schema)local_b0.parent;
      ListReader::getStructElement(&local_108,&local_b0.list.reader,index);
      local_118._0_8_ = SVar1.super_Schema.raw;
      local_118._8_4_ = index;
      local_150._4_4_ = local_d8.elementCount;
      local_150._8_8_ = " < ";
      local_150._16_8_ = &DAT_00000004;
      local_150[0x18] = index < local_d8.elementCount;
      local_150._0_4_ = index;
      if (!local_150[0x18]) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&>
                  (&local_120,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json-test.c++"
                   ,0x2da,FAILED,"field.getIndex() < items.size()","_kjCondition,",
                   (DebugComparison<unsigned_int,_unsigned_int> *)local_150);
        kj::_::Debug::Fault::fatal(&local_120);
      }
      ListBuilder::getStructElement((StructBuilder *)local_150,&local_d8,index);
      field_00._8_8_ = local_118._8_8_;
      field_00.parent.super_Schema.raw = (Schema)(Schema)local_118._0_8_;
      field_00.proto._reader.segment = local_108.segment;
      field_00.proto._reader.capTable = local_108.capTable;
      field_00.proto._reader.data = local_108.data;
      field_00.proto._reader.pointers = local_108.pointers;
      field_00.proto._reader.dataSize = local_108.dataSize;
      field_00.proto._reader.pointerCount = local_108.pointerCount;
      field_00.proto._reader._38_2_ = local_108._38_2_;
      field_00.proto._reader.nestingLimit = local_108.nestingLimit;
      field_00.proto._reader._44_4_ = local_108._44_4_;
      bVar2 = DynamicStruct::Reader::has(&input,field_00,NON_NULL);
      if (bVar2) {
        field_01._8_8_ = local_118._8_8_;
        field_01.parent.super_Schema.raw = (Schema)(Schema)local_118._0_8_;
        field_01.proto._reader.segment = local_108.segment;
        field_01.proto._reader.capTable = local_108.capTable;
        field_01.proto._reader.data = local_108.data;
        field_01.proto._reader.pointers = local_108.pointers;
        field_01.proto._reader.dataSize = local_108.dataSize;
        field_01.proto._reader.pointerCount = local_108.pointerCount;
        field_01.proto._reader._38_2_ = local_108._38_2_;
        field_01.proto._reader.nestingLimit = local_108.nestingLimit;
        field_01.proto._reader._44_4_ = local_108._44_4_;
        DynamicStruct::Reader::get(&local_78,&input,field_01);
        type = StructSchema::Field::getType((Field *)local_118);
        output_00._builder.segment._4_4_ = local_150._4_4_;
        output_00._builder.segment._0_4_ = local_150._0_4_;
        output_00._builder.pointers._1_7_ = local_150._25_7_;
        output_00._builder.pointers._0_1_ = local_150[0x18];
        output_00._builder.capTable = (CapTableBuilder *)local_150._8_8_;
        output_00._builder.data = (void *)local_150._16_8_;
        output_00._builder.dataSize = local_150._32_4_;
        output_00._builder.pointerCount = local_150._36_2_;
        output_00._builder._38_2_ = local_150._38_2_;
        JsonCodec::encode(local_128,&local_78,type,output_00);
        DynamicValue::Reader::~Reader(&local_78);
      }
      else {
        *(undefined2 *)local_150._16_8_ = 0;
      }
      index = index + 1;
    } while (local_b0.list.reader.elementCount != index);
  }
  return;
}

Assistant:

void encode(const JsonCodec& codec, DynamicStruct::Reader input,
              JsonValue::Builder output) const override {
    auto fields = input.getSchema().getFields();
    auto items = output.initArray(fields.size());
    for (auto field: fields) {
      KJ_REQUIRE(field.getIndex() < items.size());
      auto item = items[field.getIndex()];
      if (input.has(field)) {
        codec.encode(input.get(field), field.getType(), item);
      } else {
        item.setNull();
      }
    }
  }